

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O3

uint64_t protozero::detail::decode_varint_impl(char **data,char *end)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  undefined8 *puVar4;
  byte bVar5;
  byte *pbVar6;
  byte *pbVar7;
  pointer_____offset_0x10___ *ppuVar8;
  ulong uVar9;
  
  pbVar7 = (byte *)*data;
  if ((long)end - (long)pbVar7 < 10) {
    if (pbVar7 != (byte *)end) {
      bVar5 = 0;
      uVar9 = 0;
      do {
        bVar1 = *pbVar7;
        if (-1 < (char)bVar1) {
          uVar3 = (ulong)bVar1 << (bVar5 & 0x3f) | uVar9;
          goto LAB_00166b23;
        }
        pbVar7 = pbVar7 + 1;
        uVar9 = uVar9 | (ulong)(bVar1 & 0x7f) << (bVar5 & 0x3f);
        bVar5 = bVar5 + 7;
      } while (pbVar7 != (byte *)end);
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__exception_001a8788;
    ppuVar8 = &end_of_buffer_exception::typeinfo;
LAB_00166b0e:
    __cxa_throw(puVar4,ppuVar8,std::exception::~exception);
  }
  uVar2 = *pbVar7 & 0x7f;
  uVar3 = (uint64_t)uVar2;
  if ((char)*pbVar7 < '\0') {
    uVar2 = uVar2 | (pbVar7[1] & 0x7f) << 7;
    uVar3 = (uint64_t)uVar2;
    if ((char)pbVar7[1] < '\0') {
      uVar2 = uVar2 | (pbVar7[2] & 0x7f) << 0xe;
      uVar3 = (uint64_t)uVar2;
      if ((char)pbVar7[2] < '\0') {
        uVar3 = (uint64_t)(uVar2 | (pbVar7[3] & 0x7f) << 0x15);
        if ((char)pbVar7[3] < '\0') {
          uVar3 = uVar3 | (ulong)(pbVar7[4] & 0x7f) << 0x1c;
          if ((char)pbVar7[4] < '\0') {
            uVar3 = uVar3 | (ulong)(pbVar7[5] & 0x7f) << 0x23;
            if ((char)pbVar7[5] < '\0') {
              uVar3 = uVar3 | (ulong)(pbVar7[6] & 0x7f) << 0x2a;
              if ((char)pbVar7[6] < '\0') {
                uVar3 = uVar3 | (ulong)(pbVar7[7] & 0x7f) << 0x31;
                if ((char)pbVar7[7] < '\0') {
                  pbVar6 = pbVar7 + 9;
                  uVar3 = uVar3 | (ulong)(pbVar7[8] & 0x7f) << 0x38;
                  if ((char)pbVar7[8] < '\0') {
                    if ((long)(char)*pbVar6 < 0) {
                      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar4 = &PTR__exception_001a8760;
                      ppuVar8 = &varint_too_long_exception::typeinfo;
                      goto LAB_00166b0e;
                    }
                    uVar3 = uVar3 | (long)(char)*pbVar6 << 0x3f;
                    pbVar6 = pbVar7 + 10;
                  }
                }
                else {
                  pbVar6 = pbVar7 + 8;
                }
              }
              else {
                pbVar6 = pbVar7 + 7;
              }
            }
            else {
              pbVar6 = pbVar7 + 6;
            }
          }
          else {
            pbVar6 = pbVar7 + 5;
          }
        }
        else {
          pbVar6 = pbVar7 + 4;
        }
      }
      else {
        pbVar6 = pbVar7 + 3;
      }
    }
    else {
      pbVar6 = pbVar7 + 2;
    }
  }
  else {
LAB_00166b23:
    pbVar6 = pbVar7 + 1;
  }
  *data = (char *)pbVar6;
  return uVar3;
}

Assistant:

inline uint64_t decode_varint_impl(const char** data, const char* end) {
        const auto* begin = reinterpret_cast<const int8_t*>(*data);
        const auto* iend = reinterpret_cast<const int8_t*>(end);
        const int8_t* p = begin;
        uint64_t val = 0;

        if (iend - begin >= max_varint_length) {  // fast path
            do {
                int64_t b = *p++;
                          val  = ((static_cast<uint64_t>(b) & 0x7fU)       ); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) <<  7U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 14U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 21U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 28U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 35U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 42U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 49U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 56U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x01U) << 63U); if (b >= 0) { break; }
                throw varint_too_long_exception{};
            } while (false);
        } else {
            unsigned int shift = 0;
            while (p != iend && *p < 0) {
                val |= (static_cast<uint64_t>(*p++) & 0x7fU) << shift;
                shift += 7;
            }
            if (p == iend) {
                throw end_of_buffer_exception{};
            }
            val |= static_cast<uint64_t>(*p++) << shift;
        }

        *data = reinterpret_cast<const char*>(p);
        return val;
    }